

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  uint *puVar1;
  int iVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  pointer pnVar4;
  undefined8 uVar5;
  int *piVar6;
  type_conflict5 tVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  ulong uVar9;
  ulong uVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  ulong local_150;
  DataKey local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_140;
  long local_138;
  ulong local_130;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  pointer local_f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar3 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar4 = (pSVar3->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_f0 = (pSVar3->weights).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (ulong)(uint)(pSVar3->infeasibilitiesCo).super_IdxSet.num;
  local_148.info = 0;
  local_148.idx = 0;
  local_150 = 0xffffffff00000000;
  local_140 = best;
LAB_0026c063:
  uVar10 = uVar9 & 0xffffffff;
  local_130 = uVar9;
  do {
    local_130 = local_130 - 1;
    if ((int)uVar10 < 1) {
      return (SPxId)(local_150 | (ulong)local_148 & 0xffffffff);
    }
    lVar8 = (long)(((this->
                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver)->infeasibilitiesCo).super_IdxSet.idx[local_130];
    uVar5 = *(undefined8 *)((long)&pnVar4[lVar8].m_backend.data + 0x20);
    local_188.m_backend.data._M_elems._32_5_ = SUB85(uVar5,0);
    local_188.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[lVar8].m_backend.data;
    local_188.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar4[lVar8].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar4[lVar8].m_backend.data + 0x10);
    local_188.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    uVar5 = *(undefined8 *)(puVar1 + 2);
    local_188.m_backend.data._M_elems._24_5_ = SUB85(uVar5,0);
    local_188.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    local_188.m_backend.exp = pnVar4[lVar8].m_backend.exp;
    local_188.m_backend.neg = pnVar4[lVar8].m_backend.neg;
    local_188.m_backend.fpclass = pnVar4[lVar8].m_backend.fpclass;
    local_188.m_backend.prec_elem = pnVar4[lVar8].m_backend.prec_elem;
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
    local_128.m_backend.exp = (tol->m_backend).exp;
    local_128.m_backend.neg = (tol->m_backend).neg;
    local_128.m_backend.fpclass = (tol->m_backend).fpclass;
    local_128.m_backend.prec_elem = (tol->m_backend).prec_elem;
    if (local_128.m_backend.fpclass != cpp_dec_float_finite ||
        local_128.m_backend.data._M_elems[0] != 0) {
      local_128.m_backend.neg = (bool)(local_128.m_backend.neg ^ 1);
    }
    local_138 = lVar8;
    tVar7 = boost::multiprecision::operator<(&local_188,&local_128);
    if (tVar7) {
      uStack_50 = CONCAT35(local_188.m_backend.data._M_elems[7]._1_3_,
                           local_188.m_backend.data._M_elems._24_5_);
      local_68 = (steeppr  [8])local_188.m_backend.data._M_elems._0_8_;
      auStack_60[0] = local_188.m_backend.data._M_elems[2];
      auStack_60[1] = local_188.m_backend.data._M_elems[3];
      local_58[0] = local_188.m_backend.data._M_elems[4];
      local_58[1] = local_188.m_backend.data._M_elems[5];
      local_48 = CONCAT35(local_188.m_backend.data._M_elems[9]._1_3_,
                          local_188.m_backend.data._M_elems._32_5_);
      local_40 = local_188.m_backend.exp;
      local_3c = local_188.m_backend.neg;
      local_38 = local_188.m_backend.fpclass;
      iStack_34 = local_188.m_backend.prec_elem;
      local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_f0[lVar8].m_backend.data;
      local_a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&local_f0[lVar8].m_backend.data + 8);
      puVar1 = (uint *)((long)&local_f0[lVar8].m_backend.data + 0x10);
      local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&local_f0[lVar8].m_backend.data + 0x20);
      local_a8.m_backend.exp = local_f0[lVar8].m_backend.exp;
      local_a8.m_backend.neg = local_f0[lVar8].m_backend.neg;
      local_a8.m_backend.fpclass = local_f0[lVar8].m_backend.fpclass;
      local_a8.m_backend.prec_elem = local_f0[lVar8].m_backend.prec_elem;
      local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      local_e8.m_backend.exp = (tol->m_backend).exp;
      local_e8.m_backend.neg = (tol->m_backend).neg;
      local_e8.m_backend.fpclass = (tol->m_backend).fpclass;
      local_e8.m_backend.prec_elem = (tol->m_backend).prec_elem;
      steeppr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_128,local_68,&local_a8,&local_e8,in_R8);
      local_188.m_backend.data._M_elems._32_5_ = local_128.m_backend.data._M_elems._32_5_;
      local_188.m_backend.data._M_elems[9]._1_3_ = local_128.m_backend.data._M_elems[9]._1_3_;
      local_188.m_backend.data._M_elems[4] = local_128.m_backend.data._M_elems[4];
      local_188.m_backend.data._M_elems[5] = local_128.m_backend.data._M_elems[5];
      local_188.m_backend.data._M_elems._24_5_ = local_128.m_backend.data._M_elems._24_5_;
      local_188.m_backend.data._M_elems[7]._1_3_ = local_128.m_backend.data._M_elems[7]._1_3_;
      local_188.m_backend.data._M_elems[0] = local_128.m_backend.data._M_elems[0];
      local_188.m_backend.data._M_elems[1] = local_128.m_backend.data._M_elems[1];
      local_188.m_backend.data._M_elems[2] = local_128.m_backend.data._M_elems[2];
      local_188.m_backend.data._M_elems[3] = local_128.m_backend.data._M_elems[3];
      local_188.m_backend.exp = local_128.m_backend.exp;
      local_188.m_backend.neg = local_128.m_backend.neg;
      local_188.m_backend.fpclass = local_128.m_backend.fpclass;
      local_188.m_backend.prec_elem = local_128.m_backend.prec_elem;
      tVar7 = boost::multiprecision::operator>(&local_188,local_140);
      uVar9 = local_130;
      if (tVar7) break;
    }
    else {
      pSVar3 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      piVar6 = (pSVar3->infeasibilitiesCo).super_IdxSet.idx;
      iVar2 = (pSVar3->infeasibilitiesCo).super_IdxSet.num;
      (pSVar3->infeasibilitiesCo).super_IdxSet.num = iVar2 + -1;
      piVar6[local_130] = piVar6[(long)iVar2 + -1];
      (pSVar3->isInfeasibleCo).data[local_138] = 0;
    }
    uVar10 = (ulong)((int)uVar10 - 1);
  } while( true );
  *(ulong *)((local_140->m_backend).data._M_elems + 8) =
       CONCAT35(local_188.m_backend.data._M_elems[9]._1_3_,local_188.m_backend.data._M_elems._32_5_)
  ;
  *(undefined8 *)((local_140->m_backend).data._M_elems + 4) =
       local_188.m_backend.data._M_elems._16_8_;
  *(ulong *)((local_140->m_backend).data._M_elems + 6) =
       CONCAT35(local_188.m_backend.data._M_elems[7]._1_3_,local_188.m_backend.data._M_elems._24_5_)
  ;
  *(undefined8 *)(local_140->m_backend).data._M_elems = local_188.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((local_140->m_backend).data._M_elems + 2) =
       local_188.m_backend.data._M_elems._8_8_;
  (local_140->m_backend).exp = local_188.m_backend.exp;
  (local_140->m_backend).neg = local_188.m_backend.neg;
  (local_140->m_backend).fpclass = local_188.m_backend.fpclass;
  (local_140->m_backend).prec_elem = local_188.m_backend.prec_elem;
  local_148 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::id((this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).thesolver,(int)local_138);
  local_150 = (ulong)local_148 & 0xffffffff00000000;
  goto LAB_0026c063;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterSparseCoDim(R& best, R tol)
{
   SPxId enterId;
   const R* test          = this->thesolver->test().get_const_ptr();
   const R* weights_ptr   = this->thesolver->weights.get_const_ptr();

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, weights_ptr[idx], tol);

         if(x > best)
         {
            best   = x;
            enterId = this->thesolver->id(idx);
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   return enterId;
}